

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O3

TestObject *
TestObject::Create(Recycler *recycler,int pointerCount,size_t extraBytes,CreateOptions options)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  TestObject *this;
  size_t sVar7;
  type_info *_size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  lVar1 = extraBytes + (long)pointerCount * 8;
  _size = (type_info *)(lVar1 + 0x18);
  if (options == LeafObj) {
    if (pointerCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                         ,0x97,"(pointerCount == 0)","pointerCount == 0");
      if (!bVar3) goto LAB_00751565;
      *puVar6 = 0;
    }
    local_50 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_280c77f;
    data.filename._0_4_ = 0x98;
    data.typeinfo = _size;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00751565;
      *puVar6 = 0;
    }
    sVar7 = 0xffffffffffffffff;
    if (_size < (type_info *)0xffffffffffffffe8) {
      sVar7 = lVar1 + 0x30;
    }
    this = (TestObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                     (pRVar5,sVar7);
  }
  else {
    if (options != NormalObj) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                         ,0x9c,"(false)","false");
      if (bVar3) {
        *puVar6 = 0;
        return (TestObject *)0x0;
      }
      goto LAB_00751565;
    }
    local_50 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_280c77f;
    data.filename._0_4_ = 0x93;
    data.typeinfo = _size;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00751565;
      *puVar6 = 0;
    }
    sVar7 = 0xffffffffffffffff;
    if (_size < (type_info *)0xffffffffffffffe8) {
      sVar7 = lVar1 + 0x30;
    }
    this = (TestObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (pRVar5,sVar7);
  }
  if (this == (TestObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00751565:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  TestObject(this,(size_t)_size,pointerCount);
  return this;
}

Assistant:

TestObject* TestObject::Create(Recycler *recycler, int pointerCount, size_t extraBytes, CreateOptions options)
{
    size_t size = sizeof(TestObject)+pointerCount * sizeof(TestObject*) + extraBytes;

    if (options == NormalObj)
    {
        return RecyclerNewPlus(recycler, size, TestObject, size, pointerCount);
    }
    else if (options == LeafObj)
    {
        Assert(pointerCount == 0);
        return RecyclerNewPlusLeaf(recycler, size, TestObject, size, pointerCount);
    }
    else
    {
        Assert(false);
        return nullptr;
    }
}